

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

void add_intrinsic_4f_sc_4f(Context_conflict *ctx,char *fn)

{
  int iVar1;
  MOJOSHADER_astDataType *dt;
  void *value;
  MOJOSHADER_astDataType *local_28;
  MOJOSHADER_astDataType *local_20;
  
  iVar1 = hash_find((ctx->usertypes).hash,"float4",&local_28);
  if ((iVar1 == 0) || (local_28 == (MOJOSHADER_astDataType *)0x0)) {
    local_20 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_20 = (local_28->array).base;
  }
  local_28 = &ctx->dt_samplercube;
  dt = build_function_datatype(ctx,local_20,2,&local_28,1);
  push_function(ctx,fn,dt,0);
  return;
}

Assistant:

static void add_intrinsic_4f_sc_4f(Context *ctx, const char *fn)
{
    const MOJOSHADER_astDataType *f4 = get_usertype(ctx, "float4");
    add_intrinsic2(ctx, fn, f4, &ctx->dt_samplercube, f4);
}